

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O2

void __thiscall
gui::ColorPicker::handleMousePress(ColorPicker *this,Button button,Vector2f *mouseParent)

{
  Vector2f VVar1;
  Vector2f VVar2;
  float local_28;
  float fStack_24;
  
  Group::handleMousePress(&this->super_Group,button,mouseParent);
  VVar1 = Widget::toLocalOriginSpace(&(this->super_Group).super_Container.super_Widget,mouseParent);
  VVar2 = getShadingRectangleSize(this);
  if ((((button == Left) && (this->isDragging_ == false)) &&
      (local_28 = VVar1.x, local_28 < VVar2.x)) && (fStack_24 = VVar1.y, fStack_24 < VVar2.y)) {
    updateShadingRectangle(this,local_28 / VVar2.x,1.0 - fStack_24 / VVar2.y);
    this->isDragging_ = true;
  }
  return;
}

Assistant:

void ColorPicker::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    const auto shadingRectangleSize = getShadingRectangleSize();
    if (button == sf::Mouse::Left && !isDragging_ && mouseLocal.x < shadingRectangleSize.x && mouseLocal.y < shadingRectangleSize.y) {
        GUI_DEBUG << "ColorPicker::handleMousePress().\n";
        updateShadingRectangle(mouseLocal.x / shadingRectangleSize.x, 1.0f - mouseLocal.y / shadingRectangleSize.y);
        isDragging_ = true;
    }
}